

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoder_init_memory
                    (void *pData,size_t dataSize,ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  ma_result mVar1;
  long in_RCX;
  long in_RSI;
  long in_RDI;
  ma_decoder_config config;
  ma_result result;
  ma_decoder *in_stack_fffffffffffffea8;
  ma_decoder *in_stack_fffffffffffffeb0;
  ma_decoder_config *in_stack_fffffffffffffeb8;
  ma_decoder *in_stack_fffffffffffffec0;
  ma_decoder_config *in_stack_fffffffffffffec8;
  void *in_stack_fffffffffffffed0;
  ma_decoder_tell_proc in_stack_fffffffffffffed8;
  ma_decoder_seek_proc in_stack_fffffffffffffee0;
  ma_decoder_read_proc in_stack_fffffffffffffee8;
  undefined1 local_c0 [112];
  int local_50;
  ma_result local_2c;
  long local_28;
  long local_18;
  long local_10;
  ma_result local_4;
  
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  ma_decoder_config_init_copy((ma_decoder_config *)in_stack_fffffffffffffeb0);
  memcpy(local_c0,&stack0xfffffffffffffeb0,0x90);
  local_4 = ma_decoder__preinit(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  if (local_4 == MA_SUCCESS) {
    if ((local_10 == 0) || (local_18 == 0)) {
      local_4 = MA_INVALID_ARGS;
    }
    else {
      local_2c = MA_NO_BACKEND;
      if (local_50 != 0) {
        if (local_50 == 1) {
          local_2c = ma_decoder_init_wav_from_memory__internal
                               (in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                                (ma_decoder_config *)in_stack_fffffffffffffeb0,
                                in_stack_fffffffffffffea8);
        }
        if (local_50 == 2) {
          local_2c = ma_decoder_init_flac_from_memory__internal
                               (in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                                (ma_decoder_config *)in_stack_fffffffffffffeb0,
                                in_stack_fffffffffffffea8);
        }
        if (local_50 == 3) {
          local_2c = ma_decoder_init_mp3_from_memory__internal
                               (in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                                (ma_decoder_config *)in_stack_fffffffffffffeb0,
                                in_stack_fffffffffffffea8);
        }
        if (local_50 == 4) {
          local_2c = ma_decoder_init_vorbis_from_memory__internal
                               (in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                                (ma_decoder_config *)in_stack_fffffffffffffeb0,
                                in_stack_fffffffffffffea8);
        }
      }
      if (local_2c != MA_SUCCESS) {
        local_2c = ma_decoder_init_custom_from_memory__internal
                             (in_stack_fffffffffffffed8,(size_t)in_stack_fffffffffffffed0,
                              in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
        if ((local_2c != MA_SUCCESS) && (local_50 != 0)) {
          return MA_NO_BACKEND;
        }
        if (local_2c != MA_SUCCESS) {
          if (local_2c != MA_SUCCESS) {
            local_2c = ma_decoder_init_wav_from_memory__internal
                                 (in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                                  (ma_decoder_config *)in_stack_fffffffffffffeb0,
                                  in_stack_fffffffffffffea8);
          }
          if (local_2c != MA_SUCCESS) {
            local_2c = ma_decoder_init_flac_from_memory__internal
                                 (in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                                  (ma_decoder_config *)in_stack_fffffffffffffeb0,
                                  in_stack_fffffffffffffea8);
          }
          if (local_2c != MA_SUCCESS) {
            local_2c = ma_decoder_init_mp3_from_memory__internal
                                 (in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                                  (ma_decoder_config *)in_stack_fffffffffffffeb0,
                                  in_stack_fffffffffffffea8);
          }
          if (local_2c != MA_SUCCESS) {
            local_2c = ma_decoder_init_vorbis_from_memory__internal
                                 (in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                                  (ma_decoder_config *)in_stack_fffffffffffffeb0,
                                  in_stack_fffffffffffffea8);
          }
        }
      }
      if (local_2c == MA_SUCCESS) {
        local_2c = ma_decoder__postinit(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        if (local_2c != MA_SUCCESS) {
          if ((*(long *)(local_28 + 0x50) != 0) &&
             (*(long *)(*(long *)(local_28 + 0x50) + 0x20) != 0)) {
            (**(code **)(*(long *)(local_28 + 0x50) + 0x20))
                      (*(undefined8 *)(local_28 + 0x58),local_28 + 0x48,local_28 + 0x1f0);
          }
          return local_2c;
        }
      }
      else {
        local_2c = ma_decoder__preinit_memory_wrapper
                             (in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0,
                              in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        if (local_2c != MA_SUCCESS) {
          return local_2c;
        }
        mVar1 = ma_decoder_init__internal
                          ((ma_decoder_read_proc)in_stack_fffffffffffffec8,
                           (ma_decoder_seek_proc)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8
                           ,(ma_decoder_config *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8
                          );
        if (mVar1 != MA_SUCCESS) {
          return mVar1;
        }
      }
      local_4 = MA_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_decoder_init_memory(const void* pData, size_t dataSize, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;
    ma_decoder_config config;

    config = ma_decoder_config_init_copy(pConfig);

    result = ma_decoder__preinit(NULL, NULL, NULL, NULL, &config, pDecoder);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (pData == NULL || dataSize == 0) {
        return MA_INVALID_ARGS;
    }

    /* If the backend has support for loading from a file path we'll want to use that. If that all fails we'll fall back to the VFS path. */
    result = MA_NO_BACKEND;

    if (config.encodingFormat != ma_encoding_format_unknown) {
    #ifdef MA_HAS_WAV
        if (config.encodingFormat == ma_encoding_format_wav) {
            result = ma_decoder_init_wav_from_memory__internal(pData, dataSize, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (config.encodingFormat == ma_encoding_format_flac) {
            result = ma_decoder_init_flac_from_memory__internal(pData, dataSize, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_MP3
        if (config.encodingFormat == ma_encoding_format_mp3) {
            result = ma_decoder_init_mp3_from_memory__internal(pData, dataSize, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (config.encodingFormat == ma_encoding_format_vorbis) {
            result = ma_decoder_init_vorbis_from_memory__internal(pData, dataSize, &config, pDecoder);
        }
    #endif
    }

    if (result != MA_SUCCESS) {
        /* Getting here means we weren't able to initialize a decoder of a specific encoding format. */

        /*
        We use trial and error to open a decoder. We prioritize custom decoders so that if they
        implement the same encoding format they take priority over the built-in decoders.
        */
        result = ma_decoder_init_custom_from_memory__internal(pData, dataSize, &config, pDecoder);

        /*
        If we get to this point and we still haven't found a decoder, and the caller has requested a
        specific encoding format, there's no hope for it. Abort.
        */
        if (result != MA_SUCCESS && config.encodingFormat != ma_encoding_format_unknown) {
            return MA_NO_BACKEND;
        }

        /* Use trial and error for stock decoders. */
        if (result != MA_SUCCESS) {
        #ifdef MA_HAS_WAV
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_wav_from_memory__internal(pData, dataSize, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_FLAC
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_flac_from_memory__internal(pData, dataSize, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_MP3
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_mp3_from_memory__internal(pData, dataSize, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_VORBIS
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_vorbis_from_memory__internal(pData, dataSize, &config, pDecoder);
            }
        #endif
        }
    }

    /*
    If at this point we still haven't successfully initialized the decoder it most likely means
    the backend doesn't have an implementation for loading from a file path. We'll try using
    miniaudio's built-in file IO for loading file.
    */
    if (result == MA_SUCCESS) {
        /* Initialization was successful. Finish up. */
        result = ma_decoder__postinit(&config, pDecoder);
        if (result != MA_SUCCESS) {
            /*
            The backend was initialized successfully, but for some reason post-initialization failed. This is most likely
            due to an out of memory error. We're going to abort with an error here and not try to recover.
            */
            if (pDecoder->pBackendVTable != NULL && pDecoder->pBackendVTable->onUninit != NULL) {
                pDecoder->pBackendVTable->onUninit(pDecoder->pBackendUserData, &pDecoder->pBackend, &pDecoder->allocationCallbacks);
            }

            return result;
        }
    } else {
        /* Probably no implementation for loading from a block of memory. Use miniaudio's abstraction instead. */
        result = ma_decoder__preinit_memory_wrapper(pData, dataSize, &config, pDecoder);
        if (result != MA_SUCCESS) {
            return result;
        }

        result = ma_decoder_init__internal(ma_decoder__on_read_memory, ma_decoder__on_seek_memory, NULL, &config, pDecoder);
        if (result != MA_SUCCESS) {
            return result;
        }
    }

    return MA_SUCCESS;
}